

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

void cht_Take(player_t *player,char *name,int amount)

{
  APlayerPawn *pAVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  int iVar3;
  int iVar4;
  PClassActor *pPVar5;
  AInventory *pAVar6;
  PClassActor *pPVar7;
  ulong uVar8;
  
  pAVar1 = player->mo;
  if (pAVar1 == (APlayerPawn *)0x0) {
    return;
  }
  iVar4 = player->health;
  if (iVar4 < 1) {
    return;
  }
  iVar2 = strcasecmp(name,"all");
  if (iVar2 == 0) {
LAB_0039fffc:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar8 = 0;
      do {
        pPVar5 = PClassActor::AllActorClasses.Array[uVar8];
        pPVar7 = pPVar5;
        if (pPVar5 == (PClassActor *)ABackpackItem::RegistrationInfo.MyClass) {
LAB_003a003d:
          pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar5,false);
          if (pAVar6 != (AInventory *)0x0) {
            (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
          }
        }
        else {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)ABackpackItem::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if (pPVar7 != (PClassActor *)0x0) goto LAB_003a003d;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a0069:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar8 = 0;
      do {
        if (((PClassActor::AllActorClasses.Array[uVar8]->super_PClass).ParentClass ==
             AAmmo::RegistrationInfo.MyClass) &&
           (pAVar6 = AActor::FindInventory
                               (&player->mo->super_AActor,PClassActor::AllActorClasses.Array[uVar8],
                                false), pAVar6 != (AInventory *)0x0)) {
          (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar6);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a00c4:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar8 = 0;
      do {
        pPVar5 = PClassActor::AllActorClasses.Array[uVar8];
        pPVar7 = pPVar5;
        if (pPVar5 == (PClassActor *)AArmor::RegistrationInfo.MyClass) {
LAB_003a0105:
          pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar5,false);
          if (pAVar6 != (AInventory *)0x0) {
            (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])(pAVar6);
          }
        }
        else {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)AArmor::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if (pPVar7 != (PClassActor *)0x0) goto LAB_003a0105;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a0134:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar8 = 0;
      do {
        pPVar5 = PClassActor::AllActorClasses.Array[uVar8];
        pPVar7 = pPVar5;
        if (pPVar5 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_003a0175:
          pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar5,false);
          if (pAVar6 != (AInventory *)0x0) {
            (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
          }
        }
        else {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if (pPVar7 != (PClassActor *)0x0) goto LAB_003a0175;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
LAB_003a01a1:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar8 = 0;
      do {
        pPVar5 = PClassActor::AllActorClasses.Array[uVar8];
        pPVar7 = pPVar5;
        if (pPVar5 != (PClassActor *)AWeapon::RegistrationInfo.MyClass) {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if (pPVar7 != (PClassActor *)0x0) {
            pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar5,false);
            if (pAVar6 != (AInventory *)0x0) {
              (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
            }
            player->ReadyWeapon = (AWeapon *)0x0;
            player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < PClassActor::AllActorClasses.Count);
    }
    if (iVar2 != 0) {
      return;
    }
  }
  else {
    iVar3 = strcasecmp(name,"health");
    if (iVar3 == 0) {
      iVar2 = (pAVar1->super_AActor).health;
      iVar3 = iVar2 - amount;
      if ((iVar3 != 0 && amount <= iVar2) && (amount != 0 && amount < iVar4)) {
        if (amount < 1) {
          return;
        }
        (pAVar1->super_AActor).health = iVar3;
        player->health = iVar3;
        return;
      }
      cht_Suicide(player);
      if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
        return;
      }
      C_HideConsole();
      return;
    }
    iVar4 = strcasecmp(name,"backpack");
    if (iVar4 == 0) goto LAB_0039fffc;
    iVar4 = strcasecmp(name,"ammo");
    if (iVar4 == 0) goto LAB_003a0069;
    iVar4 = strcasecmp(name,"armor");
    if (iVar4 == 0) goto LAB_003a00c4;
    iVar4 = strcasecmp(name,"keys");
    if (iVar4 == 0) goto LAB_003a0134;
    iVar4 = strcasecmp(name,"weapons");
    if (iVar4 == 0) goto LAB_003a01a1;
    iVar4 = strcasecmp(name,"artifacts");
    if (iVar4 != 0) {
      iVar4 = strcasecmp(name,"puzzlepieces");
      if (iVar4 != 0) {
        pPVar5 = PClass::FindActor(name);
        if (pPVar5 == (PClassActor *)0x0) {
LAB_003a0499:
          if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
            return;
          }
          Printf("Unknown item \"%s\"\n",name);
          return;
        }
        pPVar7 = pPVar5;
        if (pPVar5 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if (pPVar7 == (PClassActor *)0x0) goto LAB_003a0499;
        }
        UNRECOVERED_JUMPTABLE =
             (player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x16];
        (*UNRECOVERED_JUMPTABLE)
                  (player->mo,pPVar5,(ulong)(amount + (uint)(amount == 0)),0,0,UNRECOVERED_JUMPTABLE
                  );
        return;
      }
      goto joined_r0x003a041b;
    }
  }
  if (PClassActor::AllActorClasses.Count != 0) {
    uVar8 = 0;
    do {
      pPVar5 = PClassActor::AllActorClasses.Array[uVar8];
      pPVar7 = pPVar5;
      if (pPVar5 == (PClassActor *)AInventory::RegistrationInfo.MyClass) {
LAB_003a028c:
        pPVar7 = pPVar5;
        if (pPVar5 != (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if ((pPVar7 == (PClassActor *)0x0) &&
             (pPVar7 = pPVar5, pPVar5 != (PClassActor *)APowerup::RegistrationInfo.MyClass)) {
            do {
              pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
              if (pPVar7 == (PClassActor *)APowerup::RegistrationInfo.MyClass) break;
            } while (pPVar7 != (PClassActor *)0x0);
            if ((pPVar7 == (PClassActor *)0x0) &&
               (pPVar7 = pPVar5, pPVar5 != (PClassActor *)AArmor::RegistrationInfo.MyClass)) {
              do {
                pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
                if (pPVar7 == (PClassActor *)AArmor::RegistrationInfo.MyClass) break;
              } while (pPVar7 != (PClassActor *)0x0);
              if ((pPVar7 == (PClassActor *)0x0) &&
                 (pPVar7 = pPVar5, pPVar5 != (PClassActor *)AWeapon::RegistrationInfo.MyClass)) {
                do {
                  pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
                  if (pPVar7 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
                } while (pPVar7 != (PClassActor *)0x0);
                if ((pPVar7 == (PClassActor *)0x0) &&
                   (pPVar7 = pPVar5, pPVar5 != (PClassActor *)AKey::RegistrationInfo.MyClass)) {
                  do {
                    pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
                    if (pPVar7 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
                  } while (pPVar7 != (PClassActor *)0x0);
                  if ((pPVar7 == (PClassActor *)0x0) &&
                     (pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar5,false),
                     pAVar6 != (AInventory *)0x0)) {
                    (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
                  }
                }
              }
            }
          }
        }
      }
      else {
        do {
          pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
          if (pPVar7 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar7 != (PClassActor *)0x0);
        if (pPVar7 != (PClassActor *)0x0) goto LAB_003a028c;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < PClassActor::AllActorClasses.Count);
  }
  if (iVar2 != 0) {
    return;
  }
joined_r0x003a041b:
  if (PClassActor::AllActorClasses.Count != 0) {
    uVar8 = 0;
    do {
      pPVar5 = PClassActor::AllActorClasses.Array[uVar8];
      pPVar7 = pPVar5;
      if (pPVar5 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) {
LAB_003a0466:
        pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar5,false);
        if (pAVar6 != (AInventory *)0x0) {
          (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
        }
      }
      else {
        do {
          pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
          if (pPVar7 == (PClassActor *)APuzzleItem::RegistrationInfo.MyClass) break;
        } while (pPVar7 != (PClassActor *)0x0);
        if (pPVar7 != (PClassActor *)0x0) goto LAB_003a0466;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < PClassActor::AllActorClasses.Count);
  }
  return;
}

Assistant:

void cht_Take (player_t *player, const char *name, int amount)
{
	bool takeall;
	PClassActor *type;

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	takeall = (stricmp (name, "all") == 0);

	if (!takeall && stricmp (name, "health") == 0)
	{
		if (player->mo->health - amount <= 0
			|| player->health - amount <= 0
			|| amount == 0)
		{

			cht_Suicide (player);

			if (player == &players[consoleplayer])
				C_HideConsole ();

			return;
		}

		if (amount > 0)
		{
			if (player->mo)
			{
				player->mo->health -= amount;
	  			player->health = player->mo->health;
			}
			else
			{
				player->health -= amount;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "backpack") == 0)
	{
		// Take away all types of backpacks the player might own.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf(RUNTIME_CLASS (ABackpackItem)))
			{
				AInventory *pack = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (pack)
					pack->Destroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "ammo") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS (AAmmo))
			{
				AInventory *ammo = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (ammo)
					ammo->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "armor") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AArmor)))
			{
				AInventory *armor = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (armor)
					armor->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AKey)))
			{
				AActor *key = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (key)
					key->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "weapons") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS (AWeapon)))
			{
				AActor *weapon = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (weapon)
					weapon->Destroy ();

				player->ReadyWeapon = nullptr;
				player->PendingWeapon = WP_NOCHANGE;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
			{
				if (!type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AArmor)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AWeapon)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AKey)))
				{
					AActor *artifact = player->mo->FindInventory(static_cast<PClassActor *>(type));

					if (artifact)
						artifact->Destroy ();
				}
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)))
			{
				AActor *puzzlepiece = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (puzzlepiece)
					puzzlepiece->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall)
		return;

	type = PClass::FindActor (name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->TakeInventory(type, amount ? amount : 1);
	}
	return;
}